

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::scan
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  char *pcVar1;
  char *pcVar2;
  pointer pCVar3;
  const_iterator item_it;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ::resize(&this->props_,
           (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  pcVar4 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar1) {
    pCVar3 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = pcVar4;
    do {
      pCVar3->uppercase = (byte)(*pcVar5 + 0xbfU) < 0x1a;
      pcVar5 = pcVar5 + 1;
      pCVar3 = pCVar3 + 1;
    } while (pcVar5 != pcVar1);
  }
  if (this->case_sensitive_ != false) {
    pcVar5 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar6 = pcVar5 == pcVar2;
    if (pcVar4 != pcVar1 && !bVar6) {
      do {
        if ((*pcVar4 == *pcVar5) && (pcVar5 = pcVar5 + 1, pcVar5 == pcVar2)) {
          return true;
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != pcVar1);
      bVar6 = false;
    }
    return bVar6;
  }
  bVar6 = scan_match<false>(this);
  return bVar6;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }